

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::drop_sustain(Renderer *this,int chan)

{
  int i_00;
  int local_18;
  int i;
  int chan_local;
  Renderer *this_local;
  
  local_18 = this->voices;
  while (i_00 = local_18 + -1, local_18 != 0) {
    local_18 = i_00;
    if (((uint)this->voice[i_00].channel == chan) && ((this->voice[i_00].status & 0x20) != 0)) {
      finish_note(this,i_00);
    }
  }
  return;
}

Assistant:

void Renderer::drop_sustain(int chan)
{
	int i = voices;
	while (i--)
	{
		if (voice[i].channel == chan && (voice[i].status & NOTE_SUSTAIN))
		{
			finish_note(i);
		}
	}
}